

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkField
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  FileDescriptorTables *this_00;
  Tables *pTVar1;
  Symbol SVar2;
  bool bVar3;
  Label LVar4;
  FieldDescriptorProto_Type FVar5;
  Type TVar6;
  CppType CVar7;
  int iVar8;
  FieldOptions *pFVar9;
  OneofDescriptor *pOVar10;
  string *psVar11;
  once_flag *poVar12;
  char *pcVar13;
  EnumDescriptor *pEVar14;
  EnumDescriptor *pEVar15;
  EnumValueDescriptor *pEVar16;
  Descriptor *pDVar17;
  string *psVar18;
  FileDescriptor *this_01;
  char *local_c18;
  byte local_bcf;
  bool local_bce;
  bool local_bcd;
  bool local_b99;
  SubstituteArg local_b58;
  SubstituteArg local_b28;
  SubstituteArg local_af8;
  SubstituteArg local_ac8;
  SubstituteArg local_a98;
  SubstituteArg local_a68;
  SubstituteArg local_a38;
  SubstituteArg local_a08;
  SubstituteArg local_9d8;
  SubstituteArg local_9a8;
  allocator local_971;
  string local_970;
  undefined1 local_950 [8];
  string error_msg;
  undefined1 local_928 [8];
  string containing_type_name_1;
  FieldDescriptor *conflicting_field_1;
  SubstituteArg local_8d0;
  SubstituteArg local_8a0;
  SubstituteArg local_870;
  SubstituteArg local_840;
  SubstituteArg local_810;
  SubstituteArg local_7e0;
  SubstituteArg local_7b0;
  SubstituteArg local_780;
  SubstituteArg local_750;
  allocator local_719;
  string local_718;
  string local_6f8;
  SubstituteArg local_6d8;
  SubstituteArg local_6a8;
  SubstituteArg local_678;
  SubstituteArg local_648;
  SubstituteArg local_618;
  SubstituteArg local_5e8;
  SubstituteArg local_5b8;
  SubstituteArg local_588;
  SubstituteArg local_558;
  SubstituteArg local_528;
  allocator local_4f1;
  string local_4f0;
  string local_4d0;
  byte local_4aa;
  allocator local_4a9;
  undefined1 local_4a8 [8];
  string containing_type_name;
  FieldDescriptor *conflicting_field;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  Symbol local_400;
  EnumValueDescriptor *local_3f8;
  EnumValueDescriptor *default_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  allocator local_329;
  string local_328;
  SymbolBase *local_308;
  StringPiece local_300;
  StringPiece local_2f0;
  undefined1 local_2e0 [8];
  string name;
  Symbol type;
  undefined1 local_2b0 [5];
  bool is_lazy;
  bool is_weak;
  bool expecting_enum;
  SubstituteArg local_280;
  SubstituteArg local_250;
  SubstituteArg local_220;
  SubstituteArg local_1f0;
  SubstituteArg local_1c0;
  SubstituteArg local_190;
  SubstituteArg local_160;
  SubstituteArg local_130;
  SubstituteArg local_100;
  allocator local_c9;
  string local_c8;
  string local_a8;
  bool local_81;
  ExtensionRange *pEStack_80;
  bool skip_check;
  ExtensionRange *extension_range;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  Symbol local_28;
  Symbol extendee;
  FieldDescriptorProto *proto_local;
  FieldDescriptor *field_local;
  DescriptorBuilder *this_local;
  
  extendee.ptr_ = (SymbolBase *)proto;
  if (*(long *)(field + 0x38) == 0) {
    pFVar9 = FieldOptions::default_instance();
    *(FieldOptions **)(field + 0x38) = pFVar9;
  }
  FileDescriptorTables::AddFieldByStylizedNames(this->file_tables_,field);
  bVar3 = FieldDescriptorProto::has_extendee((FieldDescriptorProto *)extendee.ptr_);
  if (bVar3) {
    psVar11 = FieldDescriptorProto::extendee_abi_cxx11_((FieldDescriptorProto *)extendee.ptr_);
    psVar18 = FieldDescriptor::full_name_abi_cxx11_(field);
    local_28 = LookupSymbol(this,psVar11,psVar18,PLACEHOLDER_EXTENDABLE_MESSAGE,LOOKUP_ALL,true);
    bVar3 = Symbol::IsNull(&local_28);
    if (bVar3) {
      psVar11 = FieldDescriptor::full_name_abi_cxx11_(field);
      SVar2 = extendee;
      psVar18 = FieldDescriptorProto::extendee_abi_cxx11_((FieldDescriptorProto *)extendee.ptr_);
      AddNotDefinedError(this,psVar11,(Message *)SVar2.ptr_,EXTENDEE,psVar18);
      return;
    }
    TVar6 = Symbol::type(&local_28);
    if (TVar6 != MESSAGE) {
      psVar11 = FieldDescriptor::full_name_abi_cxx11_(field);
      SVar2 = extendee;
      psVar18 = FieldDescriptorProto::extendee_abi_cxx11_((FieldDescriptorProto *)extendee.ptr_);
      std::operator+(&local_68,"\"",psVar18);
      std::operator+(&local_48,&local_68,"\" is not a message type.");
      AddError(this,psVar11,(Message *)SVar2.ptr_,EXTENDEE,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      return;
    }
    pDVar17 = Symbol::descriptor(&local_28);
    *(Descriptor **)(field + 0x20) = pDVar17;
    pDVar17 = FieldDescriptor::containing_type(field);
    iVar8 = FieldDescriptor::number(field);
    pEStack_80 = Descriptor::FindExtensionRangeContainingNumber(pDVar17,iVar8);
    if (pEStack_80 == (ExtensionRange *)0x0) {
      bVar3 = get_allow_unknown(this->pool_);
      local_b99 = false;
      if (bVar3) {
        psVar11 = FieldDescriptorProto::extendee_abi_cxx11_((FieldDescriptorProto *)extendee.ptr_);
        local_b99 = std::operator==(psVar11,"google.protobuf.bridge.MessageSet");
      }
      local_81 = local_b99;
      if (local_b99 == false) {
        psVar11 = FieldDescriptor::full_name_abi_cxx11_(field);
        SVar2 = extendee;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_c8,"\"$0\" does not declare $1 as an extension number.",
                   &local_c9);
        pDVar17 = FieldDescriptor::containing_type(field);
        psVar18 = Descriptor::full_name_abi_cxx11_(pDVar17);
        strings::internal::SubstituteArg::SubstituteArg(&local_100,psVar18);
        iVar8 = FieldDescriptor::number(field);
        strings::internal::SubstituteArg::SubstituteArg(&local_130,iVar8);
        strings::internal::SubstituteArg::SubstituteArg(&local_160);
        strings::internal::SubstituteArg::SubstituteArg(&local_190);
        strings::internal::SubstituteArg::SubstituteArg(&local_1c0);
        strings::internal::SubstituteArg::SubstituteArg(&local_1f0);
        strings::internal::SubstituteArg::SubstituteArg(&local_220);
        strings::internal::SubstituteArg::SubstituteArg(&local_250);
        strings::internal::SubstituteArg::SubstituteArg(&local_280);
        strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_2b0);
        strings::Substitute(&local_a8,&local_c8,&local_100,&local_130,&local_160,&local_190,
                            &local_1c0,&local_1f0,&local_220,&local_250,&local_280,
                            (SubstituteArg *)local_2b0);
        AddError(this,psVar11,(Message *)SVar2.ptr_,NUMBER,&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_c9);
      }
    }
  }
  pOVar10 = FieldDescriptor::containing_oneof(field);
  if ((pOVar10 != (OneofDescriptor *)0x0) &&
     (LVar4 = FieldDescriptor::label(field), LVar4 != LABEL_OPTIONAL)) {
    psVar11 = FieldDescriptor::full_name_abi_cxx11_(field);
    AddError(this,psVar11,(Message *)extendee.ptr_,NAME,
             "Fields of oneofs must themselves have label LABEL_OPTIONAL.");
  }
  bVar3 = FieldDescriptorProto::has_type_name((FieldDescriptorProto *)extendee.ptr_);
  if (bVar3) {
    FVar5 = FieldDescriptorProto::type((FieldDescriptorProto *)extendee.ptr_);
    local_bcd = true;
    if (FVar5 != FieldDescriptorProto_Type_TYPE_ENUM) {
      local_bcd = FieldDescriptorProto::has_default_value((FieldDescriptorProto *)extendee.ptr_);
    }
    local_bce = false;
    if ((this->pool_->enforce_weak_ & 1U) == 0) {
      pFVar9 = FieldDescriptorProto::options((FieldDescriptorProto *)extendee.ptr_);
      local_bce = FieldOptions::weak(pFVar9);
    }
    local_bcf = 0;
    if ((this->pool_->lazily_build_dependencies_ & 1U) != 0) {
      local_bcf = local_bce ^ 0xff;
    }
    psVar11 = FieldDescriptorProto::type_name_abi_cxx11_((FieldDescriptorProto *)extendee.ptr_);
    psVar18 = FieldDescriptor::full_name_abi_cxx11_(field);
    name.field_2._8_8_ =
         LookupSymbol(this,psVar11,psVar18,(uint)(local_bcd != false),LOOKUP_TYPES,
                      (bool)((local_bcf & 1 ^ 0xff) & 1));
    bVar3 = Symbol::IsNull((Symbol *)((long)&name.field_2 + 8));
    if (bVar3) {
      if ((local_bcf & 1) != 0) {
        psVar11 = FieldDescriptorProto::type_name_abi_cxx11_((FieldDescriptorProto *)extendee.ptr_);
        std::__cxx11::string::string((string *)local_2e0,(string *)psVar11);
        poVar12 = DescriptorPool::Tables::Create<std::once_flag>(this->tables_);
        *(once_flag **)(field + 0x18) = poVar12;
        pTVar1 = this->tables_;
        stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                  (&local_2f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0);
        pcVar13 = DescriptorPool::Tables::Strdup(pTVar1,local_2f0);
        *(char **)(field + 0x30) = pcVar13;
        bVar3 = FieldDescriptorProto::has_default_value((FieldDescriptorProto *)extendee.ptr_);
        if (bVar3) {
          pTVar1 = this->tables_;
          psVar11 = FieldDescriptorProto::default_value_abi_cxx11_
                              ((FieldDescriptorProto *)extendee.ptr_);
          stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_300,psVar11);
          local_c18 = DescriptorPool::Tables::Strdup(pTVar1,local_300);
        }
        else {
          local_c18 = (char *)0x0;
        }
        *(char **)(field + 0x40) = local_c18;
        FileDescriptorTables::AddFieldByNumber(this->file_tables_,field);
        bVar3 = FieldDescriptor::is_extension(field);
        if (bVar3) {
          DescriptorPool::Tables::AddExtension(this->tables_,field);
        }
        std::__cxx11::string::~string((string *)local_2e0);
        return;
      }
      if (local_bce != false) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_328,"google.protobuf.Empty",&local_329);
        local_308 = (SymbolBase *)FindSymbol(this,&local_328,true);
        name.field_2._8_8_ = local_308;
        std::__cxx11::string::~string((string *)&local_328);
        std::allocator<char>::~allocator((allocator<char> *)&local_329);
      }
      bVar3 = Symbol::IsNull((Symbol *)((long)&name.field_2 + 8));
      if (bVar3) {
        psVar11 = FieldDescriptor::full_name_abi_cxx11_(field);
        SVar2 = extendee;
        psVar18 = FieldDescriptorProto::type_name_abi_cxx11_((FieldDescriptorProto *)extendee.ptr_);
        AddNotDefinedError(this,psVar11,(Message *)SVar2.ptr_,TYPE,psVar18);
        return;
      }
    }
    bVar3 = FieldDescriptorProto::has_type((FieldDescriptorProto *)extendee.ptr_);
    if (!bVar3) {
      TVar6 = Symbol::type((Symbol *)((long)&name.field_2 + 8));
      if (TVar6 == MESSAGE) {
        field[2] = (FieldDescriptor)0xb;
      }
      else {
        TVar6 = Symbol::type((Symbol *)((long)&name.field_2 + 8));
        if (TVar6 != ENUM) {
          psVar11 = FieldDescriptor::full_name_abi_cxx11_(field);
          SVar2 = extendee;
          psVar18 = FieldDescriptorProto::type_name_abi_cxx11_
                              ((FieldDescriptorProto *)extendee.ptr_);
          std::operator+(&local_370,"\"",psVar18);
          std::operator+(&local_350,&local_370,"\" is not a type.");
          AddError(this,psVar11,(Message *)SVar2.ptr_,TYPE,&local_350);
          std::__cxx11::string::~string((string *)&local_350);
          std::__cxx11::string::~string((string *)&local_370);
          return;
        }
        field[2] = (FieldDescriptor)0xe;
      }
    }
    CVar7 = FieldDescriptor::cpp_type(field);
    if (CVar7 == CPPTYPE_MESSAGE) {
      pDVar17 = Symbol::descriptor((Symbol *)((long)&name.field_2 + 8));
      *(Descriptor **)(field + 0x30) = pDVar17;
      if (*(long *)(field + 0x30) == 0) {
        psVar11 = FieldDescriptor::full_name_abi_cxx11_(field);
        SVar2 = extendee;
        psVar18 = FieldDescriptorProto::type_name_abi_cxx11_((FieldDescriptorProto *)extendee.ptr_);
        std::operator+(&local_3b0,"\"",psVar18);
        std::operator+(&local_390,&local_3b0,"\" is not a message type.");
        AddError(this,psVar11,(Message *)SVar2.ptr_,TYPE,&local_390);
        std::__cxx11::string::~string((string *)&local_390);
        std::__cxx11::string::~string((string *)&local_3b0);
        return;
      }
      bVar3 = FieldDescriptor::has_default_value(field);
      if (bVar3) {
        psVar11 = FieldDescriptor::full_name_abi_cxx11_(field);
        AddError(this,psVar11,(Message *)extendee.ptr_,DEFAULT_VALUE,
                 "Messages can\'t have default values.");
      }
    }
    else {
      CVar7 = FieldDescriptor::cpp_type(field);
      if (CVar7 == CPPTYPE_ENUM) {
        pEVar14 = Symbol::enum_descriptor((Symbol *)((long)&name.field_2 + 8));
        *(EnumDescriptor **)(field + 0x30) = pEVar14;
        if (*(long *)(field + 0x30) == 0) {
          psVar11 = FieldDescriptor::full_name_abi_cxx11_(field);
          SVar2 = extendee;
          psVar18 = FieldDescriptorProto::type_name_abi_cxx11_
                              ((FieldDescriptorProto *)extendee.ptr_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &default_value,"\"",psVar18);
          std::operator+(&local_3d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &default_value,"\" is not an enum type.");
          AddError(this,psVar11,(Message *)SVar2.ptr_,TYPE,&local_3d0);
          std::__cxx11::string::~string((string *)&local_3d0);
          std::__cxx11::string::~string((string *)&default_value);
          return;
        }
        pEVar14 = FieldDescriptor::enum_type(field);
        if (((byte)pEVar14[1] & 1) != 0) {
          field[1] = (FieldDescriptor)((byte)field[1] & 0xfe);
        }
        bVar3 = FieldDescriptor::has_default_value(field);
        if (bVar3) {
          psVar11 = FieldDescriptorProto::default_value_abi_cxx11_
                              ((FieldDescriptorProto *)extendee.ptr_);
          bVar3 = io::Tokenizer::IsIdentifier(psVar11);
          if (bVar3) {
            psVar11 = FieldDescriptorProto::default_value_abi_cxx11_
                                ((FieldDescriptorProto *)extendee.ptr_);
            pEVar14 = FieldDescriptor::enum_type(field);
            psVar18 = EnumDescriptor::full_name_abi_cxx11_(pEVar14);
            local_400 = LookupSymbolNoPlaceholder(this,psVar11,psVar18,LOOKUP_ALL,true);
            local_3f8 = Symbol::enum_value_descriptor(&local_400);
            if (local_3f8 != (EnumValueDescriptor *)0x0) {
              pEVar14 = EnumValueDescriptor::type(local_3f8);
              pEVar15 = FieldDescriptor::enum_type(field);
              if (pEVar14 == pEVar15) {
                *(EnumValueDescriptor **)(field + 0x40) = local_3f8;
                goto LAB_00664159;
              }
            }
            psVar11 = FieldDescriptor::full_name_abi_cxx11_(field);
            SVar2 = extendee;
            pEVar14 = FieldDescriptor::enum_type(field);
            psVar18 = EnumDescriptor::full_name_abi_cxx11_(pEVar14);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &conflicting_field,"Enum type \"",psVar18);
            std::operator+(&local_460,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &conflicting_field,"\" has no value named \"");
            psVar18 = FieldDescriptorProto::default_value_abi_cxx11_
                                ((FieldDescriptorProto *)extendee.ptr_);
            std::operator+(&local_440,&local_460,psVar18);
            std::operator+(&local_420,&local_440,"\".");
            AddError(this,psVar11,(Message *)SVar2.ptr_,DEFAULT_VALUE,&local_420);
            std::__cxx11::string::~string((string *)&local_420);
            std::__cxx11::string::~string((string *)&local_440);
            std::__cxx11::string::~string((string *)&local_460);
            std::__cxx11::string::~string((string *)&conflicting_field);
          }
          else {
            psVar11 = FieldDescriptor::full_name_abi_cxx11_(field);
            AddError(this,psVar11,(Message *)extendee.ptr_,DEFAULT_VALUE,
                     "Default value for an enum field must be an identifier.");
          }
        }
        else {
          pEVar14 = FieldDescriptor::enum_type(field);
          iVar8 = EnumDescriptor::value_count(pEVar14);
          if (0 < iVar8) {
            pEVar14 = FieldDescriptor::enum_type(field);
            pEVar16 = EnumDescriptor::value(pEVar14,0);
            *(EnumValueDescriptor **)(field + 0x40) = pEVar16;
          }
        }
      }
      else {
        psVar11 = FieldDescriptor::full_name_abi_cxx11_(field);
        AddError(this,psVar11,(Message *)extendee.ptr_,TYPE,
                 "Field with primitive type has type_name.");
      }
    }
  }
  else {
    CVar7 = FieldDescriptor::cpp_type(field);
    if ((CVar7 == CPPTYPE_MESSAGE) ||
       (CVar7 = FieldDescriptor::cpp_type(field), CVar7 == CPPTYPE_ENUM)) {
      psVar11 = FieldDescriptor::full_name_abi_cxx11_(field);
      AddError(this,psVar11,(Message *)extendee.ptr_,TYPE,
               "Field with message or enum type missing type_name.");
    }
  }
LAB_00664159:
  bVar3 = FileDescriptorTables::AddFieldByNumber(this->file_tables_,field);
  if (bVar3) {
    bVar3 = FieldDescriptor::is_extension(field);
    if ((bVar3) && (bVar3 = DescriptorPool::Tables::AddExtension(this->tables_,field), !bVar3)) {
      pTVar1 = this->tables_;
      pDVar17 = FieldDescriptor::containing_type(field);
      iVar8 = FieldDescriptor::number(field);
      containing_type_name_1.field_2._8_8_ =
           DescriptorPool::Tables::FindExtension(pTVar1,pDVar17,iVar8);
      pDVar17 = FieldDescriptor::containing_type(field);
      error_msg.field_2._M_local_buf[0xe] = '\0';
      if (pDVar17 == (Descriptor *)0x0) {
        std::allocator<char>::allocator();
        error_msg.field_2._M_local_buf[0xe] = '\x01';
        std::__cxx11::string::string
                  ((string *)local_928,"unknown",(allocator *)(error_msg.field_2._M_local_buf + 0xf)
                  );
      }
      else {
        pDVar17 = FieldDescriptor::containing_type(field);
        psVar11 = Descriptor::full_name_abi_cxx11_(pDVar17);
        std::__cxx11::string::string((string *)local_928,(string *)psVar11);
      }
      if ((error_msg.field_2._M_local_buf[0xe] & 1U) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)(error_msg.field_2._M_local_buf + 0xf));
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_970,
                 "Extension number $0 has already been used in \"$1\" by extension \"$2\" defined in $3."
                 ,&local_971);
      iVar8 = FieldDescriptor::number(field);
      strings::internal::SubstituteArg::SubstituteArg(&local_9a8,iVar8);
      strings::internal::SubstituteArg::SubstituteArg(&local_9d8,(string *)local_928);
      psVar11 = FieldDescriptor::full_name_abi_cxx11_
                          ((FieldDescriptor *)containing_type_name_1.field_2._8_8_);
      strings::internal::SubstituteArg::SubstituteArg(&local_a08,psVar11);
      this_01 = FieldDescriptor::file((FieldDescriptor *)containing_type_name_1.field_2._8_8_);
      psVar11 = FileDescriptor::name_abi_cxx11_(this_01);
      strings::internal::SubstituteArg::SubstituteArg(&local_a38,psVar11);
      strings::internal::SubstituteArg::SubstituteArg(&local_a68);
      strings::internal::SubstituteArg::SubstituteArg(&local_a98);
      strings::internal::SubstituteArg::SubstituteArg(&local_ac8);
      strings::internal::SubstituteArg::SubstituteArg(&local_af8);
      strings::internal::SubstituteArg::SubstituteArg(&local_b28);
      strings::internal::SubstituteArg::SubstituteArg(&local_b58);
      strings::Substitute((string *)local_950,&local_970,&local_9a8,&local_9d8,&local_a08,&local_a38
                          ,&local_a68,&local_a98,&local_ac8,&local_af8,&local_b28,&local_b58);
      std::__cxx11::string::~string((string *)&local_970);
      std::allocator<char>::~allocator((allocator<char> *)&local_971);
      psVar11 = FieldDescriptor::full_name_abi_cxx11_(field);
      AddWarning(this,psVar11,(Message *)extendee.ptr_,NUMBER,(string *)local_950);
      std::__cxx11::string::~string((string *)local_950);
      std::__cxx11::string::~string((string *)local_928);
    }
  }
  else {
    this_00 = this->file_tables_;
    pDVar17 = FieldDescriptor::containing_type(field);
    iVar8 = FieldDescriptor::number(field);
    containing_type_name.field_2._8_8_ =
         FileDescriptorTables::FindFieldByNumber(this_00,pDVar17,iVar8);
    pDVar17 = FieldDescriptor::containing_type(field);
    local_4aa = 0;
    if (pDVar17 == (Descriptor *)0x0) {
      std::allocator<char>::allocator();
      local_4aa = 1;
      std::__cxx11::string::string((string *)local_4a8,"unknown",&local_4a9);
    }
    else {
      pDVar17 = FieldDescriptor::containing_type(field);
      psVar11 = Descriptor::full_name_abi_cxx11_(pDVar17);
      std::__cxx11::string::string((string *)local_4a8,(string *)psVar11);
    }
    if ((local_4aa & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
    }
    bVar3 = FieldDescriptor::is_extension(field);
    if (bVar3) {
      psVar11 = FieldDescriptor::full_name_abi_cxx11_(field);
      SVar2 = extendee;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_4f0,
                 "Extension number $0 has already been used in \"$1\" by extension \"$2\".",
                 &local_4f1);
      iVar8 = FieldDescriptor::number(field);
      strings::internal::SubstituteArg::SubstituteArg(&local_528,iVar8);
      strings::internal::SubstituteArg::SubstituteArg(&local_558,(string *)local_4a8);
      psVar18 = FieldDescriptor::full_name_abi_cxx11_
                          ((FieldDescriptor *)containing_type_name.field_2._8_8_);
      strings::internal::SubstituteArg::SubstituteArg(&local_588,psVar18);
      strings::internal::SubstituteArg::SubstituteArg(&local_5b8);
      strings::internal::SubstituteArg::SubstituteArg(&local_5e8);
      strings::internal::SubstituteArg::SubstituteArg(&local_618);
      strings::internal::SubstituteArg::SubstituteArg(&local_648);
      strings::internal::SubstituteArg::SubstituteArg(&local_678);
      strings::internal::SubstituteArg::SubstituteArg(&local_6a8);
      strings::internal::SubstituteArg::SubstituteArg(&local_6d8);
      strings::Substitute(&local_4d0,&local_4f0,&local_528,&local_558,&local_588,&local_5b8,
                          &local_5e8,&local_618,&local_648,&local_678,&local_6a8,&local_6d8);
      AddError(this,psVar11,(Message *)SVar2.ptr_,NUMBER,&local_4d0);
      std::__cxx11::string::~string((string *)&local_4d0);
      std::__cxx11::string::~string((string *)&local_4f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
    }
    else {
      psVar11 = FieldDescriptor::full_name_abi_cxx11_(field);
      SVar2 = extendee;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_718,
                 "Field number $0 has already been used in \"$1\" by field \"$2\".",&local_719);
      iVar8 = FieldDescriptor::number(field);
      strings::internal::SubstituteArg::SubstituteArg(&local_750,iVar8);
      strings::internal::SubstituteArg::SubstituteArg(&local_780,(string *)local_4a8);
      psVar18 = FieldDescriptor::name_abi_cxx11_
                          ((FieldDescriptor *)containing_type_name.field_2._8_8_);
      strings::internal::SubstituteArg::SubstituteArg(&local_7b0,psVar18);
      strings::internal::SubstituteArg::SubstituteArg(&local_7e0);
      strings::internal::SubstituteArg::SubstituteArg(&local_810);
      strings::internal::SubstituteArg::SubstituteArg(&local_840);
      strings::internal::SubstituteArg::SubstituteArg(&local_870);
      strings::internal::SubstituteArg::SubstituteArg(&local_8a0);
      strings::internal::SubstituteArg::SubstituteArg(&local_8d0);
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&conflicting_field_1);
      strings::Substitute(&local_6f8,&local_718,&local_750,&local_780,&local_7b0,&local_7e0,
                          &local_810,&local_840,&local_870,&local_8a0,&local_8d0,
                          (SubstituteArg *)&conflicting_field_1);
      AddError(this,psVar11,(Message *)SVar2.ptr_,NUMBER,&local_6f8);
      std::__cxx11::string::~string((string *)&local_6f8);
      std::__cxx11::string::~string((string *)&local_718);
      std::allocator<char>::~allocator((allocator<char> *)&local_719);
    }
    std::__cxx11::string::~string((string *)local_4a8);
  }
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkField(FieldDescriptor* field,
                                       const FieldDescriptorProto& proto) {
  if (field->options_ == nullptr) {
    field->options_ = &FieldOptions::default_instance();
  }

  // Add the field to the lowercase-name and camelcase-name tables.
  file_tables_->AddFieldByStylizedNames(field);

  if (proto.has_extendee()) {
    Symbol extendee =
        LookupSymbol(proto.extendee(), field->full_name(),
                     DescriptorPool::PLACEHOLDER_EXTENDABLE_MESSAGE);
    if (extendee.IsNull()) {
      AddNotDefinedError(field->full_name(), proto,
                         DescriptorPool::ErrorCollector::EXTENDEE,
                         proto.extendee());
      return;
    } else if (extendee.type() != Symbol::MESSAGE) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE,
               "\"" + proto.extendee() + "\" is not a message type.");
      return;
    }
    field->containing_type_ = extendee.descriptor();

    const Descriptor::ExtensionRange* extension_range =
        field->containing_type()->FindExtensionRangeContainingNumber(
            field->number());

    if (extension_range == nullptr) {
      // Set of valid extension numbers for MessageSet is different (< 2^32)
      // from other extendees (< 2^29). If unknown deps are allowed, we may not
      // have that information, and wrongly deem the extension as invalid.
      auto skip_check = get_allow_unknown(pool_) &&
                        proto.extendee() == "google.protobuf.bridge.MessageSet";
      if (!skip_check) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::NUMBER,
                 strings::Substitute("\"$0\" does not declare $1 as an "
                                  "extension number.",
                                  field->containing_type()->full_name(),
                                  field->number()));
      }
    }
  }

  if (field->containing_oneof() != nullptr) {
    if (field->label() != FieldDescriptor::LABEL_OPTIONAL) {
      // Note that this error will never happen when parsing .proto files.
      // It can only happen if you manually construct a FileDescriptorProto
      // that is incorrect.
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::NAME,
               "Fields of oneofs must themselves have label LABEL_OPTIONAL.");
    }
  }

  if (proto.has_type_name()) {
    // Assume we are expecting a message type unless the proto contains some
    // evidence that it expects an enum type.  This only makes a difference if
    // we end up creating a placeholder.
    bool expecting_enum = (proto.type() == FieldDescriptorProto::TYPE_ENUM) ||
                          proto.has_default_value();

    // In case of weak fields we force building the dependency. We need to know
    // if the type exist or not. If it doesn't exist we substitute Empty which
    // should only be done if the type can't be found in the generated pool.
    // TODO(gerbens) Ideally we should query the database directly to check
    // if weak fields exist or not so that we don't need to force building
    // weak dependencies. However the name lookup rules for symbols are
    // somewhat complicated, so I defer it too another CL.
    bool is_weak = !pool_->enforce_weak_ && proto.options().weak();
    bool is_lazy = pool_->lazily_build_dependencies_ && !is_weak;

    Symbol type =
        LookupSymbol(proto.type_name(), field->full_name(),
                     expecting_enum ? DescriptorPool::PLACEHOLDER_ENUM
                                    : DescriptorPool::PLACEHOLDER_MESSAGE,
                     LOOKUP_TYPES, !is_lazy);

    if (type.IsNull()) {
      if (is_lazy) {
        // Save the symbol names for later for lookup, and allocate the once
        // object needed for the accessors.
        std::string name = proto.type_name();
        field->type_once_ = tables_->Create<internal::once_flag>();
        field->type_descriptor_.lazy_type_name = tables_->Strdup(name);
        field->lazy_default_value_enum_name_ =
            proto.has_default_value() ? tables_->Strdup(proto.default_value())
                                      : nullptr;

        // AddFieldByNumber and AddExtension are done later in this function,
        // and can/must be done if the field type was not found. The related
        // error checking is not necessary when in lazily_build_dependencies_
        // mode, and can't be done without building the type's descriptor,
        // which we don't want to do.
        file_tables_->AddFieldByNumber(field);
        if (field->is_extension()) {
          tables_->AddExtension(field);
        }
        return;
      } else {
        // If the type is a weak type, we change the type to a google.protobuf.Empty
        // field.
        if (is_weak) {
          type = FindSymbol(kNonLinkedWeakMessageReplacementName);
        }
        if (type.IsNull()) {
          AddNotDefinedError(field->full_name(), proto,
                             DescriptorPool::ErrorCollector::TYPE,
                             proto.type_name());
          return;
        }
      }
    }

    if (!proto.has_type()) {
      // Choose field type based on symbol.
      if (type.type() == Symbol::MESSAGE) {
        field->type_ = FieldDescriptor::TYPE_MESSAGE;
      } else if (type.type() == Symbol::ENUM) {
        field->type_ = FieldDescriptor::TYPE_ENUM;
      } else {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "\"" + proto.type_name() + "\" is not a type.");
        return;
      }
    }

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      field->type_descriptor_.message_type = type.descriptor();
      if (field->type_descriptor_.message_type == nullptr) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "\"" + proto.type_name() + "\" is not a message type.");
        return;
      }

      if (field->has_default_value()) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                 "Messages can't have default values.");
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      field->type_descriptor_.enum_type = type.enum_descriptor();
      if (field->type_descriptor_.enum_type == nullptr) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "\"" + proto.type_name() + "\" is not an enum type.");
        return;
      }

      if (field->enum_type()->is_placeholder_) {
        // We can't look up default values for placeholder types.  We'll have
        // to just drop them.
        field->has_default_value_ = false;
      }

      if (field->has_default_value()) {
        // Ensure that the default value is an identifier. Parser cannot always
        // verify this because it does not have complete type information.
        // N.B. that this check yields better error messages but is not
        // necessary for correctness (an enum symbol must be a valid identifier
        // anyway), only for better errors.
        if (!io::Tokenizer::IsIdentifier(proto.default_value())) {
          AddError(field->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                   "Default value for an enum field must be an identifier.");
        } else {
          // We can't just use field->enum_type()->FindValueByName() here
          // because that locks the pool's mutex, which we have already locked
          // at this point.
          const EnumValueDescriptor* default_value =
              LookupSymbolNoPlaceholder(proto.default_value(),
                                        field->enum_type()->full_name())
                  .enum_value_descriptor();

          if (default_value != nullptr &&
              default_value->type() == field->enum_type()) {
            field->default_value_enum_ = default_value;
          } else {
            AddError(field->full_name(), proto,
                     DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                     "Enum type \"" + field->enum_type()->full_name() +
                         "\" has no value named \"" + proto.default_value() +
                         "\".");
          }
        }
      } else if (field->enum_type()->value_count() > 0) {
        // All enums must have at least one value, or we would have reported
        // an error elsewhere.  We use the first defined value as the default
        // if a default is not explicitly defined.
        field->default_value_enum_ = field->enum_type()->value(0);
      }
    } else {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "Field with primitive type has type_name.");
    }
  } else {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ||
        field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "Field with message or enum type missing type_name.");
    }
  }

  // Add the field to the fields-by-number table.
  // Note:  We have to do this *after* cross-linking because extensions do not
  // know their containing type until now. If we're in
  // lazily_build_dependencies_ mode, we're guaranteed there's no errors, so no
  // risk to calling containing_type() or other accessors that will build
  // dependencies.
  if (!file_tables_->AddFieldByNumber(field)) {
    const FieldDescriptor* conflicting_field = file_tables_->FindFieldByNumber(
        field->containing_type(), field->number());
    std::string containing_type_name =
        field->containing_type() == nullptr
            ? "unknown"
            : field->containing_type()->full_name();
    if (field->is_extension()) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER,
               strings::Substitute("Extension number $0 has already been used "
                                "in \"$1\" by extension \"$2\".",
                                field->number(), containing_type_name,
                                conflicting_field->full_name()));
    } else {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER,
               strings::Substitute("Field number $0 has already been used in "
                                "\"$1\" by field \"$2\".",
                                field->number(), containing_type_name,
                                conflicting_field->name()));
    }
  } else {
    if (field->is_extension()) {
      if (!tables_->AddExtension(field)) {
        const FieldDescriptor* conflicting_field =
            tables_->FindExtension(field->containing_type(), field->number());
        std::string containing_type_name =
            field->containing_type() == nullptr
                ? "unknown"
                : field->containing_type()->full_name();
        std::string error_msg = strings::Substitute(
            "Extension number $0 has already been used in \"$1\" by extension "
            "\"$2\" defined in $3.",
            field->number(), containing_type_name,
            conflicting_field->full_name(), conflicting_field->file()->name());
        // Conflicting extension numbers should be an error. However, before
        // turning this into an error we need to fix all existing broken
        // protos first.
        // TODO(xiaofeng): Change this to an error.
        AddWarning(field->full_name(), proto,
                   DescriptorPool::ErrorCollector::NUMBER, error_msg);
      }
    }
  }
}